

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QRect __thiscall
QPixmapStyle::scrollBarSubControlRect
          (QPixmapStyle *this,QStyleOptionComplex *option,SubControl sc,QWidget *param_3)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  QPixmapStyle *pQVar5;
  QPixmapStyle *pQVar7;
  QPixmapStyle *pQVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  QPixmapStyle *pQVar12;
  int iVar13;
  QRect QVar14;
  ulong uVar6;
  
  pQVar7 = (QPixmapStyle *)(ulong)sc;
  if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
     ((option->super_QStyleOption).type != 0xf0001)) {
    option = (QStyleOptionComplex *)0x0;
  }
  bVar2 = true;
  if (option == (QStyleOptionComplex *)0x0) {
    uVar9 = 0;
    goto LAB_00345e5c;
  }
  iVar1 = option[1].super_QStyleOption.version;
  uVar11 = ((&(option->super_QStyleOption).rect.x2)[iVar1 != 1].m_i -
           (&(option->super_QStyleOption).rect.x1)[iVar1 != 1].m_i) + 1;
  iVar10 = *(int *)&option[1].super_QStyleOption.field_0x24;
  iVar13 = (option[1].super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i - option[1].super_QStyleOption.type) + iVar10;
  iVar10 = (int)(iVar10 * uVar11) / iVar13;
  uVar4 = (int)(option[1].super_QStyleOption.rect.y2.m_i * uVar11) / iVar13 + iVar10;
  if ((int)uVar11 <= (int)uVar4) {
    uVar4 = uVar11;
  }
  pQVar5 = (QPixmapStyle *)(ulong)uVar4;
  pQVar12 = (QPixmapStyle *)(ulong)(uVar4 - iVar10);
  pQVar7 = *(QPixmapStyle **)&(option->super_QStyleOption).rect;
  uVar9._0_4_ = (option->super_QStyleOption).rect.x2;
  uVar9._4_4_ = (option->super_QStyleOption).rect.y2;
  this = (QPixmapStyle *)((ulong)pQVar7 >> 0x20);
  pQVar8 = pQVar7;
  if (iVar1 == 1) {
    if ((int)sc < 0x40) {
      pQVar8 = pQVar5;
      pQVar5 = this;
      if (sc != SC_ComboBoxArrow) {
        if (sc != SC_ComboBoxListBoxPopup) goto LAB_00345e5c;
        uVar9 = uVar9 & 0xffffffff00000000 | (ulong)pQVar12;
        pQVar8 = pQVar7;
      }
    }
    else if (sc == SC_ScrollBarSlider) {
      uVar9 = uVar9 & 0xffffffff00000000 | (ulong)pQVar5;
      pQVar8 = pQVar12;
      pQVar5 = this;
    }
    else {
LAB_00345e3b:
      pQVar5 = this;
      if (sc != SC_ScrollBarGroove) goto LAB_00345e5c;
    }
  }
  else if ((int)sc < 0x40) {
    if (sc != SC_ComboBoxArrow) {
      if (sc != SC_ComboBoxListBoxPopup) goto LAB_00345e5c;
      uVar9 = uVar9 & 0xffffffff | (long)pQVar12 << 0x20;
      pQVar5 = this;
    }
  }
  else {
    if (sc != SC_ScrollBarSlider) goto LAB_00345e3b;
    uVar9 = uVar9 & 0xffffffff | (long)pQVar5 << 0x20;
    pQVar5 = pQVar12;
  }
  bVar2 = false;
  pQVar7 = pQVar8;
  this = pQVar5;
LAB_00345e5c:
  uVar6 = 0;
  uVar3 = 0xffffffffffffffff;
  if (!bVar2) {
    uVar6 = (long)this << 0x20 | (ulong)pQVar7 & 0xffffffff;
    uVar3 = uVar9;
  }
  QVar14.x2.m_i = (int)uVar3;
  QVar14.y2.m_i = (int)(uVar3 >> 0x20);
  QVar14.x1.m_i = (int)uVar6;
  QVar14.y1.m_i = (int)(uVar6 >> 0x20);
  return QVar14;
}

Assistant:

QRect QPixmapStyle::scrollBarSubControlRect(const QStyleOptionComplex *option,
                                            QStyle::SubControl sc, const QWidget *) const
{
#if QT_CONFIG(slider)
    if (const QStyleOptionSlider *slider =
                qstyleoption_cast<const QStyleOptionSlider*>(option)) {
        int length = (slider->orientation == Qt::Horizontal)
                ? slider->rect.width() : slider->rect.height();
        int page = length * slider->pageStep
                / (slider->maximum - slider->minimum + slider->pageStep);
        int pos = length * slider->sliderValue
                / (slider->maximum - slider->minimum + slider->pageStep);
        pos = qMin(pos+page, length) - page;

        QRect rect = slider->rect;

        if (slider->orientation == Qt::Horizontal) {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setLeft(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setRight(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setLeft(pos);
                rect.setRight(pos+page);
                return rect;
            default: ;
            }
        } else {
            switch (sc) {
            case SC_ScrollBarAddPage:
                rect.setTop(pos+page);
                return rect;
            case SC_ScrollBarSubPage:
                rect.setBottom(pos);
                return rect;
            case SC_ScrollBarGroove:
                return rect;
            case SC_ScrollBarSlider:
                rect.setTop(pos);
                rect.setBottom(pos+page);
                return rect;
            default: ;
            }
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(sc);
#endif // QT_CONFIG(slider)
    return QRect();
}